

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  undefined4 extraout_EAX;
  int iVar4;
  uint32_t uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  
  secp256k1_scalar_verify(s);
  auVar12._0_4_ = -(uint)((int)s->d[2] == 0 && (int)s->d[0] == 0);
  auVar12._4_4_ = -(uint)(*(int *)((long)s->d + 0x14) == 0 && *(int *)((long)s->d + 4) == 0);
  auVar12._8_4_ = -(uint)((int)s->d[3] == 0 && (int)s->d[1] == 0);
  auVar12._12_4_ = -(uint)(*(int *)((long)s->d + 0x1c) == 0 && *(int *)((long)s->d + 0xc) == 0);
  iVar4 = movmskps(extraout_EAX,auVar12);
  if (iVar4 == 0xf) {
    uVar8 = 0;
    if (-1 < (int)(0x7f / (long)w)) {
      uVar8 = 0;
      memset(wnaf,0,(0x7f / (long)w & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    secp256k1_scalar_verify(s);
    uVar8 = ~(uint)s->d[0] & 1;
    uVar5 = secp256k1_scalar_get_bits_var(s,0,w);
    *wnaf = uVar5 + uVar8;
    iVar4 = (int)(0x7f / (long)w);
    uVar7 = iVar4 * w;
    uVar9 = 0x80 - uVar7;
    uVar6 = 0x7f / (long)w & 0xffffffff;
    if (0 < iVar4) {
      lVar10 = 0;
      uVar11 = uVar6;
      do {
        uVar3 = w;
        if (lVar10 == 0) {
          uVar3 = uVar9;
        }
        uVar5 = secp256k1_scalar_get_bits_var(s,uVar7,uVar3);
        if (uVar5 != 0) goto LAB_0014f765;
        wnaf[uVar11] = 0;
        uVar7 = uVar7 - w;
        lVar10 = lVar10 + 1;
        bVar2 = 1 < (long)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar2);
      uVar11 = 0;
LAB_0014f765:
      iVar4 = (int)uVar11;
    }
    if (0 < iVar4) {
      uVar11 = 1;
      uVar7 = w;
      do {
        uVar3 = w;
        if (uVar6 == uVar11) {
          uVar3 = uVar9;
        }
        uVar5 = secp256k1_scalar_get_bits_var(s,uVar7,uVar3);
        if ((uVar5 & 1) == 0) {
          wnaf[uVar11 - 1] = wnaf[uVar11 - 1] + (-1 << ((byte)w & 0x1f));
          uVar5 = uVar5 | 1;
        }
        wnaf[uVar11] = uVar5;
        if ((1 < uVar11) &&
           (((iVar1 = wnaf[uVar11 - 1], iVar1 == 1 && (wnaf[uVar11 - 2] < 0)) ||
            ((iVar1 == -1 && (0 < wnaf[uVar11 - 2])))))) {
          wnaf[uVar11 - 2] = wnaf[uVar11 - 2] + ((uint)(iVar1 == 1) * 2 + -1 << ((byte)w & 0x1f));
          wnaf[uVar11 - 1] = 0;
        }
        uVar11 = uVar11 + 1;
        uVar7 = uVar7 + w;
      } while (iVar4 + 1 != uVar11);
    }
  }
  return uVar8;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}